

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_abs_h(CPUTriCoreState *env,target_ulong_conflict arg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int start;
  
  uVar3 = 0;
  uVar5 = 0;
  uVar4 = 0;
  for (start = 0; start != 0x20; start = start + 0x10) {
    uVar2 = sextract32(arg,start,0x10);
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = uVar3 | 0x7fff < uVar1;
    uVar5 = uVar5 | uVar1 * 2 ^ uVar1;
    uVar4 = uVar4 | (uVar1 & 0xffff) << ((byte)start & 0x1f);
  }
  env->PSW_USB_V = uVar3 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar3 << 0x1f;
  env->PSW_USB_AV = uVar5 << 0x10;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar5 << 0x10;
  return uVar4;
}

Assistant:

uint32_t helper_abs_h(CPUTriCoreState *env, target_ulong arg)
{
    int32_t h, i;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 2; i++) {
        h = sextract32(arg, i * 16, 16);
        h = (h >= 0) ? h : (0 - h);
        ovf |= (h > 0x7FFF) || (h < -0x8000);
        avf |= h ^ h * 2u;
        ret |= (h & 0xffff) << (i * 16);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 16;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}